

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O1

void __thiscall
duckdb::Binder::PrepareModifiers
          (Binder *this,OrderBinder *order_binder,QueryNode *statement,BoundQueryNode *result)

{
  _Hash_node_base *p_Var1;
  Binder *pBVar2;
  _Head_base<0UL,_duckdb::BoundDistinctModifier_*,_false> _Var3;
  Value *this_00;
  _Head_base<0UL,_duckdb::BoundDistinctModifier_*,_false> _Var4;
  undefined8 uVar5;
  OrderType OVar6;
  pointer pRVar7;
  SelectBindState *pSVar8;
  BoundConstantExpression *pBVar9;
  pointer pBVar10;
  ConstantExpression *this_01;
  OrderModifier *pOVar11;
  DBConfig *this_02;
  reference pvVar12;
  pointer pPVar13;
  BaseExpression *this_03;
  StarExpression *pSVar14;
  pointer pBVar15;
  const_reference pvVar16;
  InternalException *this_04;
  ulong uVar17;
  _Hash_node_base *p_Var18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *order_binder_00;
  OrderBinder *order_binder_01;
  _Head_base<0UL,_duckdb::BoundDistinctModifier_*,_false> _Var19;
  vector<duckdb::OrderByNode,_true> *this_05;
  undefined8 uVar20;
  OrderType order_type;
  templated_unique_single_t bound_distinct;
  OrderByNullType null_order;
  unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
  bound_modifier;
  templated_unique_single_t constant_expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> bound_expr;
  OrderType local_159;
  _Head_base<0UL,_duckdb::BoundDistinctModifier_*,_false> local_158;
  OrderByNullType local_149;
  _Head_base<0UL,_duckdb::BoundDistinctModifier_*,_false> local_148;
  undefined1 local_140 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [3];
  unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true> *local_c8;
  vector<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>>>
  *local_c0;
  pointer local_b8;
  string local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  element_type *local_70;
  
  local_c8 = (statement->modifiers).
             super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_b8 = (statement->modifiers).
             super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_c8 != local_b8) {
    local_c0 = (vector<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>>>
                *)&result->modifiers;
    local_140._40_8_ = this;
    local_140._48_8_ = result;
    do {
      pBVar2 = (Binder *)&(((OrderBinder *)local_140)->query_component).field_2;
      local_148._M_head_impl = (BoundDistinctModifier *)0x0;
      pRVar7 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
               ::operator->(local_c8);
      switch(pRVar7->type) {
      case LIMIT_MODIFIER:
        pRVar7 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                 ::operator->(local_c8);
        ResultModifier::Cast<duckdb::LimitModifier>(pRVar7);
        BindLimit(pBVar2,(OrderBinder *)local_140._40_8_,(LimitModifier *)order_binder);
        goto LAB_01786ebb;
      case ORDER_MODIFIER:
        pRVar7 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                 ::operator->(local_c8);
        pOVar11 = ResultModifier::Cast<duckdb::OrderModifier>(pRVar7);
        pBVar9 = (BoundConstantExpression *)operator_new(0x28);
        BoundOrderModifier::BoundOrderModifier((BoundOrderModifier *)pBVar9);
        local_158._M_head_impl = (BoundDistinctModifier *)pBVar9;
        this_02 = DBConfig::GetConfig(*(ClientContext **)(local_140._40_8_ + 0x10));
        if ((long)(pOVar11->orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pOVar11->orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_start == 0x10) {
          this_05 = &pOVar11->orders;
          pvVar12 = vector<duckdb::OrderByNode,_true>::operator[](this_05,0);
          pPVar13 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(&pvVar12->expression);
          if ((pPVar13->super_BaseExpression).type == STAR) {
            pvVar12 = vector<duckdb::OrderByNode,_true>::operator[](this_05,0);
            this_03 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->(&pvVar12->expression)->super_BaseExpression;
            pSVar14 = BaseExpression::Cast<duckdb::StarExpression>(this_03);
            if ((((pSVar14->exclude_list)._M_h._M_element_count == 0) &&
                ((pSVar14->replace_list)._M_h._M_element_count == 0)) &&
               ((pSVar14->expr).
                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
                (ParsedExpression *)0x0)) {
              pvVar12 = vector<duckdb::OrderByNode,_true>::operator[](this_05,0);
              OVar6 = DBConfig::ResolveOrder(this_02,pvVar12->type);
              local_159 = OVar6;
              pvVar12 = vector<duckdb::OrderByNode,_true>::operator[](this_05,0);
              local_149 = DBConfig::ResolveNullOrder(this_02,OVar6,pvVar12->null_order);
              Value::Value((Value *)&stack0xffffffffffffff90,"ALL");
              pBVar9 = (BoundConstantExpression *)operator_new(0x98);
              Value::Value((Value *)pBVar2,(Value *)&stack0xffffffffffffff90);
              BoundConstantExpression::BoundConstantExpression(pBVar9,(Value *)pBVar2);
              local_140._0_8_ = pBVar9;
              Value::~Value((Value *)pBVar2);
              Value::~Value((Value *)&stack0xffffffffffffff90);
              pBVar15 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                        ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                                      *)&local_158);
              ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
              emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                        ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>
                          *)&pBVar15->orders,&local_159,&local_149,
                         (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                          *)local_140);
              _Var4._M_head_impl = local_148._M_head_impl;
              local_148._M_head_impl = local_158._M_head_impl;
              local_158._M_head_impl = (BoundDistinctModifier *)0x0;
              _Var19._M_head_impl = local_148._M_head_impl;
              _Var3._M_head_impl = (BoundDistinctModifier *)local_140._0_8_;
              if ((BoundConstantExpression *)_Var4._M_head_impl != (BoundConstantExpression *)0x0) {
                (*(((Expression *)&(_Var4._M_head_impl)->super_BoundResultModifier)->
                  super_BaseExpression)._vptr_BaseExpression[1])();
                _Var19._M_head_impl = local_148._M_head_impl;
                _Var3._M_head_impl = (BoundDistinctModifier *)local_140._0_8_;
              }
              goto joined_r0x017870cd;
            }
          }
        }
        pSVar8 = (SelectBindState *)
                 (pOVar11->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_140._32_8_ =
             (pOVar11->orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (pSVar8 != (SelectBindState *)local_140._32_8_) {
          do {
            local_108._M_allocated_capacity = 0;
            local_108._8_8_ = (BoundConstantExpression *)0x0;
            local_f8[0]._M_allocated_capacity = 0;
            pvVar16 = vector<std::reference_wrapper<duckdb::Binder>,_true>::operator[]
                                (&order_binder->binders,0);
            pBVar2 = pvVar16->_M_data;
            local_140._16_8_ = (pSVar8->alias_map)._M_h._M_bucket_count;
            (pSVar8->alias_map)._M_h._M_bucket_count = 0;
            ExpandStarExpression
                      (pBVar2,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)&(((OrderBinder *)local_140)->binders).
                                  super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                                  .
                                  super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        *)&(((OrderBinder *)local_140)->query_component).field_2);
            if ((pointer)local_140._16_8_ != (pointer)0x0) {
              (*(code *)((*(Binder **)local_140._16_8_)->
                        super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)();
            }
            local_140._16_8_ = (pointer)0x0;
            OVar6 = DBConfig::ResolveOrder
                              (this_02,*(OrderType *)&(pSVar8->alias_map)._M_h._M_buckets);
            local_140[0] = OVar6;
            order_binder_01 = (OrderBinder *)(ulong)OVar6;
            local_159 = DBConfig::ResolveNullOrder
                                  (this_02,OVar6,
                                   *(OrderByNullType *)
                                    ((long)&(pSVar8->alias_map)._M_h._M_buckets + 1));
            uVar5 = local_108._8_8_;
            for (uVar20 = local_108._M_allocated_capacity; uVar20 != uVar5;
                uVar20 = &(((BoundConstantExpression *)uVar20)->super_Expression).
                          super_BaseExpression.type) {
              local_140._8_8_ =
                   (((BoundConstantExpression *)uVar20)->super_Expression).super_BaseExpression.
                   _vptr_BaseExpression;
              (((BoundConstantExpression *)uVar20)->super_Expression).super_BaseExpression.
              _vptr_BaseExpression = (_func_int **)0x0;
              BindOrderExpression((Binder *)&stack0xffffffffffffff90,order_binder_01,
                                  (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)order_binder);
              if ((pointer)local_140._8_8_ != (pointer)0x0) {
                (*(code *)((*(Binder **)local_140._8_8_)->
                          super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)();
              }
              local_140._8_8_ = (pointer)0x0;
              if (local_70 != (element_type *)0x0) {
                pBVar15 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                          ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                                        *)&local_158);
                order_binder_01 = (OrderBinder *)local_140;
                ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
                emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>
                            *)&pBVar15->orders,(OrderType *)order_binder_01,&local_159,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&stack0xffffffffffffff90);
              }
              if (local_70 != (element_type *)0x0) {
                (**(code **)((long)(local_70->super_enable_shared_from_this<duckdb::Binder>).
                                   __weak_this_.internal.
                                   super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr + 8))();
              }
            }
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       *)&(((OrderBinder *)local_140)->query_component).field_2);
            pSVar8 = (SelectBindState *)&(pSVar8->alias_map)._M_h._M_before_begin;
          } while (pSVar8 != (SelectBindState *)local_140._32_8_);
        }
        pBVar15 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                  ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                                *)&local_158);
        _Var19._M_head_impl = local_158._M_head_impl;
        if ((pBVar15->orders).
            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pBVar15->orders).
            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_158._M_head_impl = (BoundDistinctModifier *)0x0;
          _Var3._M_head_impl = local_148._M_head_impl;
          goto joined_r0x017870cd;
        }
        break;
      case DISTINCT_MODIFIER:
        pRVar7 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                 ::operator->(local_c8);
        pSVar8 = (SelectBindState *)ResultModifier::Cast<duckdb::DistinctModifier>(pRVar7);
        pBVar9 = (BoundConstantExpression *)operator_new(0x28);
        BoundDistinctModifier::BoundDistinctModifier((BoundDistinctModifier *)pBVar9);
        p_Var18 = (pSVar8->alias_map)._M_h._M_before_begin._M_nxt;
        p_Var1 = (_Hash_node_base *)(pSVar8->alias_map)._M_h._M_element_count;
        local_158._M_head_impl = (BoundDistinctModifier *)pBVar9;
        pBVar10 = unique_ptr<duckdb::BoundDistinctModifier,_std::default_delete<duckdb::BoundDistinctModifier>,_true>
                  ::operator->((unique_ptr<duckdb::BoundDistinctModifier,_std::default_delete<duckdb::BoundDistinctModifier>,_true>
                                *)&local_158);
        (pBVar10->super_BoundResultModifier).field_0x9 = p_Var18 != p_Var1;
        this_00 = (Value *)&(((OrderBinder *)local_140)->query_component).field_2;
        local_140._32_8_ = pSVar8;
        if (((pSVar8->alias_map)._M_h._M_before_begin._M_nxt ==
             (_Hash_node_base *)(pSVar8->alias_map)._M_h._M_element_count) &&
           ((((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *)(local_140._48_8_ + 0x28))->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *)(local_140._48_8_ + 0x28))->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)) {
          uVar17 = 0;
          do {
            uVar17 = uVar17 + 1;
            Value::INTEGER((Value *)&stack0xffffffffffffff90,(int32_t)uVar17);
            this_01 = (ConstantExpression *)operator_new(0x78);
            Value::Value(this_00,(Value *)&stack0xffffffffffffff90);
            ConstantExpression::ConstantExpression(this_01,this_00);
            Value::~Value(this_00);
            local_140._0_8_ = this_01;
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)&(pSVar8->alias_map)._M_h._M_before_begin,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)local_140);
            if ((ConstantExpression *)local_140._0_8_ != (ConstantExpression *)0x0) {
              (*(((ParsedExpression *)local_140._0_8_)->super_BaseExpression)._vptr_BaseExpression
                [1])();
            }
            local_140._0_8_ = (BoundConstantExpression *)0x0;
            Value::~Value((Value *)&stack0xffffffffffffff90);
          } while (uVar17 < (ulong)((long)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                             *)(local_140._48_8_ + 0x28))->
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                             *)(local_140._48_8_ + 0x28))->
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        local_90._M_allocated_capacity = (size_type)&local_80;
        order_binder_00 = &local_90;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)order_binder_00,"DISTINCT ON","");
        OrderBinder::SetQueryComponent(order_binder,(string *)order_binder_00);
        uVar20 = local_140._32_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_allocated_capacity != &local_80) {
          operator_delete((void *)local_90._M_allocated_capacity);
        }
        p_Var1 = (_Hash_node_base *)
                 (((case_insensitive_map_t<idx_t> *)uVar20)->_M_h)._M_element_count;
        for (p_Var18 = (((case_insensitive_map_t<idx_t> *)uVar20)->_M_h)._M_before_begin._M_nxt;
            p_Var18 != p_Var1; p_Var18 = p_Var18 + 1) {
          local_140._24_8_ = p_Var18->_M_nxt;
          p_Var18->_M_nxt = (_Hash_node_base *)0x0;
          BindOrderExpression((Binder *)&(((OrderBinder *)local_140)->query_component).field_2,
                              (OrderBinder *)order_binder_00,
                              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)order_binder);
          if ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               *)local_140._24_8_ !=
              (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               *)0x0) {
            (*(code *)*(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                        *)&(((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              *)local_140._24_8_)->
                           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[1].
                           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           ._M_t)();
          }
          local_140._24_8_ =
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)0x0;
          if ((BoundConstantExpression *)local_108._M_allocated_capacity !=
              (BoundConstantExpression *)0x0) {
            pBVar10 = unique_ptr<duckdb::BoundDistinctModifier,_std::default_delete<duckdb::BoundDistinctModifier>,_true>
                      ::operator->((unique_ptr<duckdb::BoundDistinctModifier,_std::default_delete<duckdb::BoundDistinctModifier>,_true>
                                    *)&local_158);
            order_binder_00 = &(((OrderBinder *)local_140)->query_component).field_2;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&pBVar10->target_distincts,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&order_binder_00->_M_allocated_capacity);
          }
          if ((BoundConstantExpression *)local_108._M_allocated_capacity !=
              (BoundConstantExpression *)0x0) {
            (**(code **)(*(long *)local_108._M_allocated_capacity + 8))();
          }
        }
        local_b0._M_string_length = 0;
        local_b0.field_2._M_local_buf[0] = '\0';
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        OrderBinder::SetQueryComponent(order_binder,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        _Var19._M_head_impl = local_158._M_head_impl;
        local_158._M_head_impl = (BoundDistinctModifier *)0x0;
        _Var3._M_head_impl = local_148._M_head_impl;
joined_r0x017870cd:
        local_148._M_head_impl = _Var19._M_head_impl;
        _Var19._M_head_impl = local_158._M_head_impl;
        if ((BoundConstantExpression *)_Var3._M_head_impl != (BoundConstantExpression *)0x0) {
          (*(((BoundConstantExpression *)_Var3._M_head_impl)->super_Expression).super_BaseExpression
            ._vptr_BaseExpression[1])();
          _Var19._M_head_impl = local_158._M_head_impl;
        }
        break;
      case LIMIT_PERCENT_MODIFIER:
        pRVar7 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                 ::operator->(local_c8);
        ResultModifier::Cast<duckdb::LimitPercentModifier>(pRVar7);
        BindLimitPercent(pBVar2,(OrderBinder *)local_140._40_8_,(LimitPercentModifier *)order_binder
                        );
LAB_01786ebb:
        uVar20 = local_108._M_allocated_capacity;
        _Var19._M_head_impl = local_148._M_head_impl;
        local_108._M_allocated_capacity = 0;
        local_148._M_head_impl = (BoundDistinctModifier *)uVar20;
        break;
      default:
        this_04 = (InternalException *)__cxa_allocate_exception(0x10);
        local_108._M_allocated_capacity = (size_type)local_f8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&(((OrderBinder *)local_140)->query_component).field_2,
                   "Unsupported result modifier","");
        InternalException::InternalException
                  (this_04,(string *)&(((OrderBinder *)local_140)->query_component).field_2);
        __cxa_throw(this_04,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((BoundConstantExpression *)_Var19._M_head_impl != (BoundConstantExpression *)0x0) {
        (*(((BoundConstantExpression *)_Var19._M_head_impl)->super_Expression).super_BaseExpression.
          _vptr_BaseExpression[1])();
      }
      if ((BoundConstantExpression *)local_148._M_head_impl != (BoundConstantExpression *)0x0) {
        ::std::
        vector<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>>
                  (local_c0,(unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                             *)&local_148);
      }
      if ((BoundConstantExpression *)local_148._M_head_impl != (BoundConstantExpression *)0x0) {
        (*(((Expression *)&(local_148._M_head_impl)->super_BoundResultModifier)->
          super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_c8 = local_c8 + 1;
    } while (local_c8 != local_b8);
  }
  return;
}

Assistant:

void Binder::PrepareModifiers(OrderBinder &order_binder, QueryNode &statement, BoundQueryNode &result) {
	for (auto &mod : statement.modifiers) {
		unique_ptr<BoundResultModifier> bound_modifier;
		switch (mod->type) {
		case ResultModifierType::DISTINCT_MODIFIER: {
			auto &distinct = mod->Cast<DistinctModifier>();
			auto bound_distinct = make_uniq<BoundDistinctModifier>();
			bound_distinct->distinct_type =
			    distinct.distinct_on_targets.empty() ? DistinctType::DISTINCT : DistinctType::DISTINCT_ON;
			if (distinct.distinct_on_targets.empty()) {
				for (idx_t i = 0; i < result.names.size(); i++) {
					distinct.distinct_on_targets.push_back(
					    make_uniq<ConstantExpression>(Value::INTEGER(UnsafeNumericCast<int32_t>(1 + i))));
				}
			}
			order_binder.SetQueryComponent("DISTINCT ON");
			for (auto &distinct_on_target : distinct.distinct_on_targets) {
				auto expr = BindOrderExpression(order_binder, std::move(distinct_on_target));
				if (!expr) {
					continue;
				}
				bound_distinct->target_distincts.push_back(std::move(expr));
			}
			order_binder.SetQueryComponent();

			bound_modifier = std::move(bound_distinct);
			break;
		}
		case ResultModifierType::ORDER_MODIFIER: {

			auto &order = mod->Cast<OrderModifier>();
			auto bound_order = make_uniq<BoundOrderModifier>();
			auto &config = DBConfig::GetConfig(context);
			D_ASSERT(!order.orders.empty());
			auto &order_binders = order_binder.GetBinders();
			if (order.orders.size() == 1 && order.orders[0].expression->GetExpressionType() == ExpressionType::STAR) {
				auto &star = order.orders[0].expression->Cast<StarExpression>();
				if (star.exclude_list.empty() && star.replace_list.empty() && !star.expr) {
					// ORDER BY ALL
					// replace the order list with the all elements in the SELECT list
					auto order_type = config.ResolveOrder(order.orders[0].type);
					auto null_order = config.ResolveNullOrder(order_type, order.orders[0].null_order);
					auto constant_expr = make_uniq<BoundConstantExpression>(Value("ALL"));
					bound_order->orders.emplace_back(order_type, null_order, std::move(constant_expr));
					bound_modifier = std::move(bound_order);
					break;
				}
			}
#if 0
			// When this verification is enabled, replace ORDER BY x, y with ORDER BY create_sort_key(x, y)
			// note that we don't enable this during actual verification since it doesn't always work
			// e.g. it breaks EXPLAIN output on queries
			bool can_replace = true;
			for (auto &order_node : order.orders) {
				if (order_node.expression->GetExpressionType() == ExpressionType::VALUE_CONSTANT) {
					// we cannot replace the sort key when we order by literals (e.g. ORDER BY 1, 2`
					can_replace = false;
					break;
				}
			}
			if (!order_binder.HasExtraList()) {
				// we can only do the replacement when we can order by elements that are not in the selection list
				can_replace = false;
			}
			if (can_replace) {
				vector<unique_ptr<ParsedExpression>> sort_key_parameters;
				for (auto &order_node : order.orders) {
					sort_key_parameters.push_back(std::move(order_node.expression));
					auto type = config.ResolveOrder(order_node.type);
					auto null_order = config.ResolveNullOrder(type, order_node.null_order);
					string sort_param = EnumUtil::ToString(type) + " " + EnumUtil::ToString(null_order);
					sort_key_parameters.push_back(make_uniq<ConstantExpression>(Value(sort_param)));
				}
				order.orders.clear();
				auto create_sort_key = make_uniq<FunctionExpression>("create_sort_key", std::move(sort_key_parameters));
				order.orders.emplace_back(OrderType::ASCENDING, OrderByNullType::NULLS_LAST, std::move(create_sort_key));
			}
#endif
			for (auto &order_node : order.orders) {
				vector<unique_ptr<ParsedExpression>> order_list;
				order_binders[0].get().ExpandStarExpression(std::move(order_node.expression), order_list);

				auto type = config.ResolveOrder(order_node.type);
				auto null_order = config.ResolveNullOrder(type, order_node.null_order);
				for (auto &order_expr : order_list) {
					auto bound_expr = BindOrderExpression(order_binder, std::move(order_expr));
					if (!bound_expr) {
						continue;
					}
					bound_order->orders.emplace_back(type, null_order, std::move(bound_expr));
				}
			}
			if (!bound_order->orders.empty()) {
				bound_modifier = std::move(bound_order);
			}
			break;
		}
		case ResultModifierType::LIMIT_MODIFIER:
			bound_modifier = BindLimit(order_binder, mod->Cast<LimitModifier>());
			break;
		case ResultModifierType::LIMIT_PERCENT_MODIFIER:
			bound_modifier = BindLimitPercent(order_binder, mod->Cast<LimitPercentModifier>());
			break;
		default:
			throw InternalException("Unsupported result modifier");
		}
		if (bound_modifier) {
			result.modifiers.push_back(std::move(bound_modifier));
		}
	}
}